

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O1

string * __thiscall
CoreML::dimensionRangesToString_abi_cxx11_
          (string *__return_storage_ptr__,CoreML *this,
          vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *rangePerDimension,
          bool useArrayFormat)

{
  byte bVar1;
  string *psVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  char *pcVar6;
  undefined1 in_R8B;
  string separator;
  stringstream ss;
  long *local_200;
  long local_1f8;
  long local_1f0 [2];
  string local_1e0;
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  bVar1 = (byte)rangePerDimension;
  std::__cxx11::stringstream::stringstream(local_1b8);
  pcVar6 = anon_var_dwarf_73062a;
  if ((int)rangePerDimension != 0) {
    pcVar6 = ", ";
  }
  local_200 = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_200,pcVar6,pcVar6 + (ulong)(bVar1 ^ 1) * 2 + 2);
  if (bVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
  }
  lVar3 = *(long *)this;
  local_1c0 = __return_storage_ptr__;
  if (*(long *)(this + 8) != lVar3) {
    lVar5 = 8;
    uVar4 = 0;
    do {
      rangeToString_abi_cxx11_
                (&local_1e0,*(CoreML **)(lVar3 + -8 + lVar5),*(int64_t *)(lVar3 + lVar5),
                 (ulong)rangePerDimension & 0xff,(bool)in_R8B);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      if (uVar4 < (*(long *)(this + 8) - *(long *)this >> 4) - 1U) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_200,local_1f8);
      }
      uVar4 = uVar4 + 1;
      lVar3 = *(long *)this;
      lVar5 = lVar5 + 0x10;
    } while (uVar4 < (ulong)(*(long *)(this + 8) - lVar3 >> 4));
  }
  psVar2 = local_1c0;
  if (bVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"]",1);
  }
  std::__cxx11::stringbuf::str();
  if (local_200 != local_1f0) {
    operator_delete(local_200,local_1f0[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

static std::string dimensionRangesToString(const std::vector<std::pair<int64_t,int64_t>> &rangePerDimension, bool useArrayFormat = false) {
        std::stringstream ss;
        std::string separator = useArrayFormat ? ", " : " × ";

        if (useArrayFormat) {
            ss << "[";
        }

        for (size_t i = 0; i < rangePerDimension.size(); i++) {
            ss << rangeToString(rangePerDimension[i].first,rangePerDimension[i].second,useArrayFormat);
            if (i < rangePerDimension.size() - 1) { ss << separator; }
        }

        if (useArrayFormat) {
            ss << "]";
        }

        return ss.str();
    }